

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdflib.cpp
# Opt level: O1

double beta_rcomp(double *a,double *b,double *x,double *y)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double local_38;
  
  dVar5 = 0.0;
  if (((*x != 0.0) || (NAN(*x))) && ((*y != 0.0 || (NAN(*y))))) {
    beta_rcomp::a0 = *a;
    if (*b <= *a) {
      beta_rcomp::a0 = *b;
    }
    if (8.0 <= beta_rcomp::a0) {
      dVar5 = *a;
      dVar2 = *b;
      if (dVar5 <= dVar2) {
        dVar3 = dVar5 / dVar2 + 1.0;
        beta_rcomp::x0 = (dVar5 / dVar2) / dVar3;
        beta_rcomp::y0 = 1.0 / dVar3;
        beta_rcomp::lambda = dVar5 - (dVar5 + dVar2) * *x;
      }
      else {
        dVar3 = dVar2 / dVar5 + 1.0;
        beta_rcomp::x0 = 1.0 / dVar3;
        beta_rcomp::y0 = (dVar2 / dVar5) / dVar3;
        beta_rcomp::lambda = (dVar5 + dVar2) * *y - dVar2;
      }
      dVar5 = -beta_rcomp::lambda / dVar5;
      beta_rcomp::e = dVar5;
      if (ABS(dVar5) <= 0.6) {
        beta_rcomp::u = rlog1(&beta_rcomp::e);
      }
      else {
        dVar2 = log(*x / beta_rcomp::x0);
        beta_rcomp::u = dVar5 - dVar2;
      }
      dVar5 = beta_rcomp::lambda / *b;
      beta_rcomp::e = dVar5;
      if (ABS(dVar5) <= 0.6) {
        dVar5 = rlog1(&beta_rcomp::e);
      }
      else {
        dVar2 = log(*y / beta_rcomp::y0);
        dVar5 = dVar5 - dVar2;
      }
      beta_rcomp::z = exp(-(*a * beta_rcomp::u + dVar5 * *b));
      dVar5 = *b * beta_rcomp::x0;
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      local_38 = dVar5 * 0.398942280401433 * beta_rcomp::z;
      dVar5 = bcorr(a,b);
      dVar5 = -dVar5;
    }
    else {
      dVar5 = *x;
      if (dVar5 <= 0.375) {
        beta_rcomp::lnx = log(dVar5);
        beta_rcomp::T1 = -*x;
        beta_rcomp::lny = alnrel(&beta_rcomp::T1);
      }
      else {
        if (*y <= 0.375) {
          beta_rcomp::T2 = -*y;
          beta_rcomp::lnx = alnrel(&beta_rcomp::T2);
        }
        else {
          beta_rcomp::lnx = log(dVar5);
        }
        beta_rcomp::lny = log(*y);
      }
      dVar5 = *a;
      dVar2 = *b;
      beta_rcomp::z = beta_rcomp::lnx * dVar5 + beta_rcomp::lny * dVar2;
      if (1.0 <= beta_rcomp::a0) {
        dVar5 = beta_log(a,b);
        beta_rcomp::z = beta_rcomp::z - dVar5;
        dVar5 = exp(beta_rcomp::z);
        return dVar5;
      }
      beta_rcomp::b0 = dVar2;
      if (dVar2 <= dVar5) {
        beta_rcomp::b0 = dVar5;
      }
      if (beta_rcomp::b0 < 8.0) {
        if (1.0 < beta_rcomp::b0) {
          beta_rcomp::u = gamma_ln1(&beta_rcomp::a0);
          iVar1 = (int)(beta_rcomp::b0 + -1.0);
          if (0 < iVar1) {
            dVar5 = 1.0;
            do {
              beta_rcomp::b0 = beta_rcomp::b0 + -1.0;
              dVar5 = dVar5 * (beta_rcomp::b0 / (beta_rcomp::b0 + beta_rcomp::a0));
              iVar1 = iVar1 + -1;
            } while (iVar1 != 0);
            dVar5 = log(dVar5);
            beta_rcomp::u = dVar5 + beta_rcomp::u;
          }
          dVar5 = beta_rcomp::z - beta_rcomp::u;
          beta_rcomp::b0 = beta_rcomp::b0 + -1.0;
          beta_rcomp::apb = beta_rcomp::b0 + beta_rcomp::a0;
          beta_rcomp::z = dVar5;
          if (beta_rcomp::apb <= 1.0) {
            dVar2 = gam1(&beta_rcomp::apb);
            beta_rcomp::t = dVar2 + 1.0;
          }
          else {
            beta_rcomp::u = beta_rcomp::apb + -1.0;
            dVar2 = gam1(&beta_rcomp::u);
            beta_rcomp::t = (dVar2 + 1.0) / beta_rcomp::apb;
          }
          dVar2 = beta_rcomp::a0;
          dVar5 = exp(dVar5);
          dVar3 = gam1(&beta_rcomp::b0);
          return ((dVar3 + 1.0) * dVar5 * dVar2) / beta_rcomp::t;
        }
        dVar5 = exp(beta_rcomp::z);
        if ((dVar5 == 0.0) && (!NAN(dVar5))) {
          return dVar5;
        }
        beta_rcomp::apb = *a + *b;
        if (beta_rcomp::apb <= 1.0) {
          dVar2 = gam1(&beta_rcomp::apb);
          dVar2 = dVar2 + 1.0;
        }
        else {
          beta_rcomp::u = *a + *b + -1.0;
          dVar2 = gam1(&beta_rcomp::u);
          dVar2 = (dVar2 + 1.0) / beta_rcomp::apb;
        }
        beta_rcomp::z = dVar2;
        dVar3 = gam1(a);
        dVar4 = gam1(b);
        return (dVar5 * (((dVar4 + 1.0) * (dVar3 + 1.0)) / dVar2) * beta_rcomp::a0) /
               (beta_rcomp::a0 / beta_rcomp::b0 + 1.0);
      }
      dVar5 = gamma_ln1(&beta_rcomp::a0);
      dVar2 = algdiv(&beta_rcomp::a0,&beta_rcomp::b0);
      beta_rcomp::u = dVar2 + dVar5;
      local_38 = beta_rcomp::a0;
      dVar5 = beta_rcomp::z - beta_rcomp::u;
    }
    dVar5 = exp(dVar5);
    dVar5 = dVar5 * local_38;
  }
  return dVar5;
}

Assistant:

double beta_rcomp ( double *a, double *b, double *x, double *y )

//****************************************************************************80
//
//  Purpose:
//
//    BETA_RCOMP evaluates X**A * Y**B / Beta(A,B).
//
//  Parameters:
//
//    Input, double *A, *B, the parameters of the Beta function.
//    A and B should be nonnegative.
//
//    Input, double *X, *Y, define the numerator of the fraction.
//
//    Output, double BETA_RCOMP, the value of X**A * Y**B / Beta(A,B).
//
{
  static double Const = .398942280401433e0;
  static double brcomp,a0,apb,b0,c,e,h,lambda,lnx,lny,t,u,v,x0,y0,z;
  static int i,n;
//
//  CONST = 1/SQRT(2*PI)
//
  static double T1,T2;

    brcomp = 0.0e0;
    if(*x == 0.0e0 || *y == 0.0e0) return brcomp;
    a0 = fifdmin1(*a,*b);
    if(a0 >= 8.0e0) goto S130;
    if(*x > 0.375e0) goto S10;
    lnx = log(*x);
    T1 = -*x;
    lny = alnrel(&T1);
    goto S30;
S10:
    if(*y > 0.375e0) goto S20;
    T2 = -*y;
    lnx = alnrel(&T2);
    lny = log(*y);
    goto S30;
S20:
    lnx = log(*x);
    lny = log(*y);
S30:
    z = *a*lnx+*b*lny;
    if(a0 < 1.0e0) goto S40;
    z -= beta_log(a,b);
    brcomp = exp(z);
    return brcomp;
S40:
//
//  PROCEDURE FOR A .LT. 1 OR B .LT. 1
//
    b0 = fifdmax1(*a,*b);
    if(b0 >= 8.0e0) goto S120;
    if(b0 > 1.0e0) goto S70;
//
//  ALGORITHM FOR B0 .LE. 1
//
    brcomp = exp(z);
    if(brcomp == 0.0e0) return brcomp;
    apb = *a+*b;
    if(apb > 1.0e0) goto S50;
    z = 1.0e0+gam1(&apb);
    goto S60;
S50:
    u = *a+*b-1.e0;
    z = (1.0e0+gam1(&u))/apb;
S60:
    c = (1.0e0+gam1(a))*(1.0e0+gam1(b))/z;
    brcomp = brcomp*(a0*c)/(1.0e0+a0/b0);
    return brcomp;
S70:
//
//  ALGORITHM FOR 1 .LT. B0 .LT. 8
//
    u = gamma_ln1 ( &a0 );
    n = int( b0 - 1.0e0 );
    if(n < 1) goto S90;
    c = 1.0e0;
    for ( i = 1; i <= n; i++ )
    {
        b0 -= 1.0e0;
        c *= (b0/(a0+b0));
    }
    u = log(c)+u;
S90:
    z -= u;
    b0 -= 1.0e0;
    apb = a0+b0;
    if(apb > 1.0e0) goto S100;
    t = 1.0e0+gam1(&apb);
    goto S110;
S100:
    u = a0+b0-1.e0;
    t = (1.0e0+gam1(&u))/apb;
S110:
    brcomp = a0*exp(z)*(1.0e0+gam1(&b0))/t;
    return brcomp;
S120:
//
//  ALGORITHM FOR B0 .GE. 8
//
    u = gamma_ln1 ( &a0 ) + algdiv ( &a0, &b0 );
    brcomp = a0*exp(z-u);
    return brcomp;
S130:
//
//  PROCEDURE FOR A .GE. 8 AND B .GE. 8
//
    if(*a > *b) goto S140;
    h = *a/ *b;
    x0 = h/(1.0e0+h);
    y0 = 1.0e0/(1.0e0+h);
    lambda = *a-(*a+*b)**x;
    goto S150;
S140:
    h = *b/ *a;
    x0 = 1.0e0/(1.0e0+h);
    y0 = h/(1.0e0+h);
    lambda = (*a+*b)**y-*b;
S150:
    e = -(lambda/ *a);
    if(fabs(e) > 0.6e0) goto S160;
    u = rlog1(&e);
    goto S170;
S160:
    u = e-log(*x/x0);
S170:
    e = lambda/ *b;
    if(fabs(e) > 0.6e0) goto S180;
    v = rlog1(&e);
    goto S190;
S180:
    v = e-log(*y/y0);
S190:
    z = exp(-(*a*u+*b*v));
    brcomp = Const*sqrt(*b*x0)*z*exp(-bcorr(a,b));
    return brcomp;
}